

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O0

SUNErrCode SUNLinSolInitialize_SPBCGS(SUNLinearSolver S)

{
  SUNContext_conflict sunctx_local_scope_;
  SUNLinearSolver S_local;
  
  if (*S->content < 1) {
    *(undefined4 *)S->content = 5;
  }
  if (((*(int *)((long)S->content + 4) != 1) && (*(int *)((long)S->content + 4) != 2)) &&
     (*(int *)((long)S->content + 4) != 3)) {
    *(undefined4 *)((long)S->content + 4) = 0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolInitialize_SPBCGS(SUNLinearSolver S)
{
  SUNFunctionBegin(S->sunctx);

  if (SPBCGS_CONTENT(S)->maxl <= 0)
  {
    SPBCGS_CONTENT(S)->maxl = SUNSPBCGS_MAXL_DEFAULT;
  }

  SUNAssert(SPBCGS_CONTENT(S)->ATimes, SUN_ERR_ARG_CORRUPT);

  if ((PRETYPE(S) != SUN_PREC_LEFT) && (PRETYPE(S) != SUN_PREC_RIGHT) &&
      (PRETYPE(S) != SUN_PREC_BOTH))
  {
    PRETYPE(S) = SUN_PREC_NONE;
  }

  SUNAssert((PRETYPE(S) == SUN_PREC_NONE) || SPBCGS_CONTENT(S)->Psolve,
            SUN_ERR_ARG_CORRUPT);

  /* no additional memory to allocate */

  /* return with success */
  return SUN_SUCCESS;
}